

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O1

int CheckFromArray(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar3 = -1;
    pcVar4 = "can\'t open out.txt";
    goto LAB_001024c9;
  }
  if (testInOut[testN].n < 1) {
LAB_00102486:
    iVar3 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar3 == 0) {
      iVar3 = 0;
      pcVar4 = "PASSED";
      goto LAB_001024c9;
    }
  }
  else {
    bVar1 = true;
    lVar5 = 0;
    do {
      pcVar4 = ScanInt((FILE *)__stream,(int *)((long)&uStack_38 + 4));
      if ((pcVar4 != "PASSED") ||
         (bVar2 = true, *(int *)((long)testN * 0x110 + 0x106cdc + lVar5 * 4) != uStack_38._4_4_)) {
        bVar1 = false;
        printf("wrong output -- ");
        bVar2 = false;
      }
    } while ((bVar2) && (lVar5 = lVar5 + 1, lVar5 < testInOut[testN].n));
    if (bVar1) goto LAB_00102486;
    fclose(__stream);
  }
  iVar3 = 1;
  pcVar4 = "FAILED";
LAB_001024c9:
  puts(pcVar4);
  testN = testN + 1;
  return iVar3;
}

Assistant:

static int CheckFromArray(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }
    for (int i = 0; i < testInOut[testN].n; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
        ++testN;
        return 1;
    }
}